

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

HighsInt __thiscall
HighsOrbitopeMatrix::orbitalFixingForFullOrbitope
          (HighsOrbitopeMatrix *this,vector<int,_std::allocator<int>_> *rows,HighsDomain *domain)

{
  Reason reason;
  Reason reason_00;
  bool bVar1;
  HighsInt HVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  char *pcVar7;
  int8_t *piVar8;
  int8_t *piVar9;
  char *pcVar10;
  HighsBoundType *pHVar11;
  int iVar12;
  int iVar13;
  Reason in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  int *in_RDI;
  HighsInt colrj;
  HighsInt r_1;
  HighsInt i_1;
  int8_t *colMinimal;
  int8_t *colMaximal;
  HighsInt j_3;
  HighsInt numFixed;
  HighsInt k_6;
  int8_t isFree_3;
  HighsInt k_5;
  HighsInt i_d_1;
  int8_t isFree_2;
  HighsInt k_4;
  HighsInt i_f_1;
  int8_t *colj1_1;
  int8_t *colj0_1;
  HighsInt j_2;
  HighsInt k_3;
  int8_t isFree_1;
  HighsInt k_2;
  HighsInt i_d;
  int8_t isFree;
  HighsInt k_1;
  HighsInt i_f;
  int8_t *colj1;
  int8_t *colj0;
  HighsInt j_1;
  anon_class_1_0_00000001 i_discr;
  anon_class_8_1_d8bc2d90 i_fixed;
  HighsInt k;
  int8_t *MmaximaljFirst;
  int8_t *MminimaljLast;
  vector<signed_char,_std::allocator<signed_char>_> Mmaximal;
  HighsInt colij;
  HighsInt r;
  HighsInt i;
  HighsInt j;
  vector<signed_char,_std::allocator<signed_char>_> Mminimal;
  HighsInt numDynamicRows;
  HighsDomain *in_stack_fffffffffffffe18;
  undefined5 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe25;
  undefined1 in_stack_fffffffffffffe26;
  undefined1 in_stack_fffffffffffffe27;
  Reason in_stack_fffffffffffffe28;
  HighsInt in_stack_fffffffffffffe30;
  HighsBoundType in_stack_fffffffffffffe34;
  HighsBoundType boundtype;
  Reason in_stack_fffffffffffffe38;
  Reason in_stack_fffffffffffffe40;
  vector<signed_char,_std::allocator<signed_char>_> *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  int local_13c;
  int local_124;
  int local_120;
  int local_11c;
  int local_114;
  int local_100;
  int local_e4;
  int local_e0;
  int local_d8;
  int local_c0;
  int local_a8;
  anon_class_1_0_00000001 local_a1;
  anon_class_8_1_d8bc2d90 local_a0;
  int local_94;
  char *local_90;
  char *local_88;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  undefined1 local_41;
  vector<signed_char,_std::allocator<signed_char>_> local_40;
  int local_24;
  Reason local_20;
  vector<int,_std::allocator<int>_> *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  local_24 = (int)sVar3;
  local_41 = 0xff;
  std::allocator<signed_char>::allocator((allocator<signed_char> *)0x6c5e88);
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)in_stack_fffffffffffffe40,
             (size_type)in_stack_fffffffffffffe38,
             (value_type_conflict *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             (allocator_type *)in_stack_fffffffffffffe28);
  std::allocator<signed_char>::~allocator((allocator<signed_char> *)0x6c5ebc);
  for (local_58 = 0; local_58 < *in_RDI; local_58 = local_58 + 1) {
    for (local_5c = 0; local_5c < local_24; local_5c = local_5c + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)local_5c);
      local_60 = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x14),
                          (long)(local_60 + local_58 * in_RDI[1]));
      local_64 = *pvVar4;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)((long)local_20 + 0x308),
                          (long)local_64);
      if ((*pvVar5 != 1.0) || (NAN(*pvVar5))) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)((long)local_20 + 800),
                            (long)local_64);
        if ((*pvVar5 == 0.0) && (!NAN(*pvVar5))) {
          pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                             (&local_40,(long)(local_5c + local_58 * local_24));
          *pvVar6 = '\0';
        }
      }
      else {
        pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           (&local_40,(long)(local_5c + local_58 * local_24));
        *pvVar6 = '\x01';
      }
    }
  }
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),in_stack_fffffffffffffe68
            );
  local_88 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                       ((vector<signed_char,_std::allocator<signed_char>_> *)0x6c6078);
  local_88 = local_88 + local_24 * (*in_RDI + -1);
  local_90 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                       ((vector<signed_char,_std::allocator<signed_char>_> *)0x6c60a7);
  for (local_94 = 0; local_94 < local_24; local_94 = local_94 + 1) {
    if (local_88[local_94] == -1) {
      local_88[local_94] = '\0';
    }
    if (local_90[local_94] == -1) {
      local_90[local_94] = '\x01';
    }
  }
  local_a0.numDynamicRows = &local_24;
  for (local_a8 = *in_RDI + -2; -1 < local_a8; local_a8 = local_a8 + -1) {
    pcVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                       ((vector<signed_char,_std::allocator<signed_char>_> *)0x6c6197);
    piVar8 = pcVar7 + local_a8 * local_24;
    piVar9 = piVar8 + local_24;
    HVar2 = orbitalFixingForFullOrbitope::anon_class_8_1_d8bc2d90::operator()
                      (&local_a0,piVar8,piVar9);
    if (HVar2 == local_24) {
      for (local_c0 = 0; local_c0 < local_24; local_c0 = local_c0 + 1) {
        piVar8[local_c0] =
             piVar8[local_c0] +
             (piVar8[local_c0] == -1 & piVar9[local_c0]) + (piVar8[local_c0] == -1);
      }
    }
    else {
      local_e0 = orbitalFixingForFullOrbitope::anon_class_1_0_00000001::operator()
                           (&local_a1,piVar8,piVar9,HVar2);
      if (local_e0 == -1) {
        HighsDomain::Reason::unspecified();
        reason.index._1_1_ = in_stack_fffffffffffffe25;
        reason._0_5_ = in_stack_fffffffffffffe20;
        reason.index._2_1_ = in_stack_fffffffffffffe26;
        reason.index._3_1_ = in_stack_fffffffffffffe27;
        HighsDomain::markInfeasible(in_stack_fffffffffffffe18,reason);
        local_4 = 0;
        goto LAB_006c6a70;
      }
      for (local_d8 = 0; local_d8 < local_e0; local_d8 = local_d8 + 1) {
        piVar8[local_d8] =
             piVar8[local_d8] +
             (piVar8[local_d8] == -1 & piVar9[local_d8]) + (piVar8[local_d8] == -1);
      }
      piVar8[local_e0] = '\x01';
      while (local_e0 = local_e0 + 1, local_e0 < local_24) {
        piVar8[local_e0] = piVar8[local_e0] + (piVar8[local_e0] == -1);
      }
    }
  }
  for (local_e4 = 1; local_e4 < *in_RDI; local_e4 = local_e4 + 1) {
    pcVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                       ((vector<signed_char,_std::allocator<signed_char>_> *)0x6c64c6);
    piVar8 = pcVar7 + local_e4 * local_24;
    piVar9 = piVar8 + -(long)local_24;
    HVar2 = orbitalFixingForFullOrbitope::anon_class_8_1_d8bc2d90::operator()
                      (&local_a0,piVar9,piVar8);
    if (HVar2 == local_24) {
      for (local_100 = 0; local_100 < local_24; local_100 = local_100 + 1) {
        piVar8[local_100] =
             piVar8[local_100] +
             (piVar8[local_100] == -1 & piVar9[local_100]) + (piVar8[local_100] == -1);
      }
    }
    else {
      local_11c = orbitalFixingForFullOrbitope::anon_class_1_0_00000001::operator()
                            (&local_a1,piVar9,piVar8,HVar2);
      if (local_11c == -1) {
        HighsDomain::Reason::unspecified();
        reason_00.index._1_1_ = in_stack_fffffffffffffe25;
        reason_00._0_5_ = in_stack_fffffffffffffe20;
        reason_00.index._2_1_ = in_stack_fffffffffffffe26;
        reason_00.index._3_1_ = in_stack_fffffffffffffe27;
        HighsDomain::markInfeasible(in_stack_fffffffffffffe18,reason_00);
        local_4 = 0;
        goto LAB_006c6a70;
      }
      for (local_114 = 0; local_114 < local_11c; local_114 = local_114 + 1) {
        piVar8[local_114] =
             piVar8[local_114] +
             (piVar8[local_114] == -1 & piVar9[local_114]) + (piVar8[local_114] == -1);
      }
      piVar8[local_11c] = '\0';
      while (local_11c = local_11c + 1, local_11c < local_24) {
        piVar8[local_11c] = piVar8[local_11c] + (piVar8[local_11c] == -1) * '\x02';
      }
    }
  }
  local_120 = 0;
  for (local_124 = 0; local_124 < *in_RDI; local_124 = local_124 + 1) {
    pcVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                       ((vector<signed_char,_std::allocator<signed_char>_> *)0x6c67d8);
    iVar12 = local_124 * local_24;
    pcVar10 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                        ((vector<signed_char,_std::allocator<signed_char>_> *)0x6c6802);
    iVar13 = local_124 * local_24;
    local_13c = 0;
    while ((local_13c < local_24 &&
           (pcVar10[(long)local_13c + (long)iVar13] == pcVar7[(long)local_13c + (long)iVar12]))) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)local_13c);
      pHVar11 = (HighsBoundType *)
                std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x14),
                           (long)(*pvVar4 + local_124 * in_RDI[1]));
      boundtype = *pHVar11;
      bVar1 = HighsDomain::isFixed
                        ((HighsDomain *)
                         CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                         in_stack_fffffffffffffe28.index);
      if (!bVar1) {
        local_120 = local_120 + 1;
        if (pcVar10[(long)local_13c + (long)iVar13] == '\x01') {
          in_stack_fffffffffffffe40 = local_20;
          HighsDomain::Reason::unspecified();
          HighsDomain::changeBound
                    ((HighsDomain *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                     in_stack_fffffffffffffe30,(double)in_stack_fffffffffffffe28,
                     in_stack_fffffffffffffe40);
        }
        else {
          in_stack_fffffffffffffe28 = local_20;
          in_stack_fffffffffffffe38 = HighsDomain::Reason::unspecified();
          HighsDomain::changeBound
                    ((HighsDomain *)in_stack_fffffffffffffe38,boundtype,in_stack_fffffffffffffe30,
                     (double)in_stack_fffffffffffffe28,in_stack_fffffffffffffe40);
          in_stack_fffffffffffffe34 = boundtype;
        }
        bVar1 = HighsDomain::infeasible((HighsDomain *)local_20);
        if (bVar1) break;
      }
      local_13c = local_13c + 1;
    }
    bVar1 = HighsDomain::infeasible((HighsDomain *)local_20);
    if (bVar1) break;
  }
  bVar1 = HighsDomain::infeasible((HighsDomain *)local_20);
  if (!bVar1) {
    HighsDomain::propagate((HighsDomain *)colMaximal);
  }
  local_4 = local_120;
LAB_006c6a70:
  std::vector<signed_char,_std::allocator<signed_char>_>::~vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  std::vector<signed_char,_std::allocator<signed_char>_>::~vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  return local_4;
}

Assistant:

HighsInt HighsOrbitopeMatrix::orbitalFixingForFullOrbitope(
    const std::vector<HighsInt>& rows, HighsDomain& domain) const {
  HighsInt numDynamicRows = rows.size();
  std::vector<int8_t> Mminimal(numDynamicRows * rowLength, -1);

  for (HighsInt j = 0; j < rowLength; ++j) {
    for (HighsInt i = 0; i < numDynamicRows; ++i) {
      HighsInt r = rows[i];
      HighsInt colij = matrix[r + j * numRows];
      if (domain.col_lower_[colij] == 1.0)
        Mminimal[i + j * numDynamicRows] = 1;
      else if (domain.col_upper_[colij] == 0.0)
        Mminimal[i + j * numDynamicRows] = 0;
    }
  }

  std::vector<int8_t> Mmaximal = Mminimal;

  int8_t* MminimaljLast = Mminimal.data() + numDynamicRows * (rowLength - 1);
  int8_t* MmaximaljFirst = Mmaximal.data();
  for (HighsInt k = 0; k < numDynamicRows; ++k) {
    if (MminimaljLast[k] == -1) MminimaljLast[k] = 0;
    if (MmaximaljFirst[k] == -1) MmaximaljFirst[k] = 1;
  }

  auto i_fixed = [&](const int8_t* colj0, const int8_t* colj1) {
    for (HighsInt i = 0; i < numDynamicRows; ++i) {
      if (colj0[i] != -1 && colj1[i] != -1 && colj0[i] != colj1[i]) return i;
    }

    return numDynamicRows;
  };

  auto i_discr = [&](const int8_t* colj0, const int8_t* colj1, HighsInt i_f) {
    for (HighsInt i = i_f; i >= 0; --i) {
      if (colj0[i] != 0 && colj1[i] != 1) return i;
    }

    return HighsInt{-1};
  };

  for (HighsInt j = rowLength - 2; j >= 0; --j) {
    int8_t* colj0 = Mminimal.data() + j * numDynamicRows;
    int8_t* colj1 = colj0 + numDynamicRows;
    HighsInt i_f = i_fixed(colj0, colj1);

    if (i_f == numDynamicRows) {
      for (HighsInt k = 0; k < numDynamicRows; ++k) {
        int8_t isFree = (colj0[k] == -1);
        colj0[k] += (isFree & colj1[k]) + isFree;
      }
    } else {
      HighsInt i_d = i_discr(colj0, colj1, i_f);
      if (i_d == -1) {
        domain.markInfeasible();
        return 0;
      }

      for (HighsInt k = 0; k < i_d; ++k) {
        int8_t isFree = (colj0[k] == -1);
        colj0[k] += (isFree & colj1[k]) + isFree;
      }
      colj0[i_d] = 1;
      for (HighsInt k = i_d + 1; k < numDynamicRows; ++k)
        colj0[k] += (colj0[k] == -1);
    }
  }

  for (HighsInt j = 1; j < rowLength; ++j) {
    int8_t* colj0 = Mmaximal.data() + j * numDynamicRows;
    int8_t* colj1 = colj0 - numDynamicRows;
    HighsInt i_f = i_fixed(colj1, colj0);

    if (i_f == numDynamicRows) {
      for (HighsInt k = 0; k < numDynamicRows; ++k) {
        int8_t isFree = (colj0[k] == -1);
        colj0[k] += (isFree & colj1[k]) + isFree;
      }
    } else {
      HighsInt i_d = i_discr(colj1, colj0, i_f);
      if (i_d == -1) {
        domain.markInfeasible();
        return 0;
      }
      for (HighsInt k = 0; k < i_d; ++k) {
        int8_t isFree = (colj0[k] == -1);
        colj0[k] += (isFree & colj1[k]) + isFree;
      }
      colj0[i_d] = 0;
      for (HighsInt k = i_d + 1; k < numDynamicRows; ++k)
        colj0[k] += 2 * (colj0[k] == -1);
    }
  }

  HighsInt numFixed = 0;

  for (HighsInt j = 0; j < rowLength; ++j) {
    const int8_t* colMaximal = Mmaximal.data() + j * numDynamicRows;
    const int8_t* colMinimal = Mminimal.data() + j * numDynamicRows;

    for (HighsInt i = 0; i < numDynamicRows; ++i) {
      if (colMinimal[i] != colMaximal[i]) {
        assert(colMinimal[i] < colMaximal[i]);
        break;
      }

      HighsInt r = rows[i];
      HighsInt colrj = matrix[r + j * numRows];
      if (domain.isFixed(colrj)) continue;

      ++numFixed;
      if (colMinimal[i] == 1)
        domain.changeBound(HighsBoundType::kLower, colrj, 1.0,
                           HighsDomain::Reason::unspecified());
      else
        domain.changeBound(HighsBoundType::kUpper, colrj, 0.0,
                           HighsDomain::Reason::unspecified());
      if (domain.infeasible()) break;
    }
    if (domain.infeasible()) break;
  }

  if (!domain.infeasible()) domain.propagate();

  return numFixed;
}